

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  dynbuf *pdVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  size_t sVar5;
  char *pcVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  _Bool eos;
  size_t nread;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  if ((pcVar3->proto).ftpc.pp.sendbuf.leng == 0) {
    pcVar6 = (pcVar3->proto).ftpc.pp.sendbuf.bufr;
    if (pcVar6 == (char *)0x0) goto LAB_00150a9b;
    nread = (size_t)(char *)0x9000;
    if (pcVar6 < (char *)0x9000) {
      nread = (size_t)pcVar6;
    }
    CVar8 = Curl_client_read(data,(pcVar3->proto).smbc.send_buf,nread,&nread,&eos);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (nread == 0) {
      return CURLE_OK;
    }
    pdVar2 = &(pcVar3->proto).ftpc.pp.sendbuf;
    pdVar2->bufr = pdVar2->bufr + -nread;
    (pcVar3->proto).ftpc.pp.sendbuf.leng = nread;
    (pcVar3->proto).ftpc.pp.sendbuf.allc = 0;
  }
  pcVar4 = data->conn;
  sVar12 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
  if (sVar12 != 0) {
    sVar5 = (pcVar4->proto).ftpc.pp.sendbuf.allc;
    sVar12 = sVar12 - sVar5;
    CVar8 = Curl_xfer_send(data,(pcVar4->proto).smbc.send_buf + sVar5,sVar12,false,&nread);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (nread == sVar12) {
      (pcVar4->proto).ftpc.pp.sendbuf.leng = 0;
    }
    else {
      psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.allc;
      *psVar1 = *psVar1 + nread;
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.leng != 0) {
    return CURLE_AGAIN;
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr != (char *)0x0) {
    return CURLE_AGAIN;
  }
LAB_00150a9b:
  pcVar3 = data->conn;
  pcVar6 = (pcVar3->proto).smbc.recv_buf;
  sVar12 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
  CVar8 = Curl_xfer_recv(data,pcVar6 + sVar12,0x9000 - sVar12,(ssize_t *)&nread);
  if (((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, nread != 0)) &&
     (uVar9 = nread + (pcVar3->proto).ftpc.pp.sendbuf.toobig,
     (pcVar3->proto).ftpc.pp.sendbuf.toobig = uVar9, 3 < uVar9)) {
    uVar7 = Curl_read16_be((uchar *)(pcVar6 + 2));
    if ((ulong)uVar7 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.toobig) {
      if (0x20 < uVar7) {
        uVar10 = (uint)(byte)pcVar6[0x24] * 2 + 0x27;
        uVar11 = (uint)((ulong)uVar7 + 4);
        if ((uVar10 <= uVar11) &&
           (uVar7 = Curl_read16_le((uchar *)(pcVar6 + (ulong)((uint)(byte)pcVar6[0x24] * 2) + 0x25))
           , uVar11 < uVar10 + uVar7)) {
          return CURLE_READ_ERROR;
        }
      }
      *msg = pcVar6;
    }
  }
  return CVar8;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}